

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O2

FieldSymbol * __thiscall
slang::ast::Scope::memberAt<slang::ast::FieldSymbol>(Scope *this,uint32_t index)

{
  iterator iVar1;
  ulong uVar2;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar3;
  
  sVar3 = members(this);
  iVar1 = sVar3._M_begin.current;
  for (uVar2 = (ulong)index; 0 < (long)uVar2; uVar2 = uVar2 - 1) {
    iVar1.current =
         (((FieldSymbol *)iVar1.current)->super_VariableSymbol).super_ValueSymbol.super_Symbol.
         nextInScope;
  }
  return (FieldSymbol *)iVar1.current;
}

Assistant:

const T& memberAt(uint32_t index) const {
        return std::ranges::next(members().begin(), index)->as<T>();
    }